

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

bool __thiscall S2Polyline::MayIntersect(S2Polyline *this,S2Cell *cell)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  S2Point *pSVar4;
  int i_1;
  uint k;
  int k_00;
  ulong uVar5;
  int i;
  long lVar6;
  S2EdgeCrosser crosser;
  S2Point cell_vertices [4];
  
  k = 0;
  if (this->num_vertices_ != 0) {
    do {
      if (this->num_vertices_ <= (int)k) {
        pSVar4 = cell_vertices;
        cell_vertices[3].c_[1] = 0.0;
        cell_vertices[3].c_[2] = 0.0;
        cell_vertices[2].c_[2] = 0.0;
        cell_vertices[3].c_[0] = 0.0;
        cell_vertices[2].c_[0] = 0.0;
        cell_vertices[2].c_[1] = 0.0;
        cell_vertices[1].c_[1] = 0.0;
        cell_vertices[1].c_[2] = 0.0;
        cell_vertices[0].c_[2] = 0.0;
        cell_vertices[1].c_[0] = 0.0;
        cell_vertices[0].c_[0] = 0.0;
        cell_vertices[0].c_[1] = 0.0;
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          S2Cell::GetVertex((S2Point *)&crosser,cell,(int)lVar6);
          pSVar4->c_[2] = crosser.a_cross_b_.c_[0];
          pSVar4->c_[0] = (VType)crosser.a_;
          pSVar4->c_[1] = (VType)crosser.b_;
          pSVar4 = pSVar4 + 1;
        }
        uVar1 = 0;
        while (uVar5 = uVar1, uVar5 != 4) {
          pSVar4 = vertex(this,0);
          S2EdgeCrosser::S2EdgeCrosser
                    (&crosser,cell_vertices + uVar5,cell_vertices + ((uint)(uVar5 + 1) & 3),pSVar4);
          k_00 = 1;
          while (uVar1 = uVar5 + 1, k_00 < this->num_vertices_) {
            pSVar4 = vertex(this,k_00);
            iVar3 = S2EdgeCrosser::CrossingSign(&crosser,pSVar4);
            k_00 = k_00 + 1;
            if (-1 < iVar3) {
              k = (uint)(uVar5 < 4);
              goto LAB_0024b749;
            }
          }
        }
        k = 0;
        goto LAB_0024b749;
      }
      pSVar4 = vertex(this,k);
      bVar2 = S2Cell::Contains(cell,pSVar4);
      k = k + 1;
    } while (!bVar2);
    k = 1;
  }
LAB_0024b749:
  return SUB41(k,0);
}

Assistant:

bool S2Polyline::MayIntersect(const S2Cell& cell) const {
  if (num_vertices() == 0) return false;

  // We only need to check whether the cell contains vertex 0 for correctness,
  // but these tests are cheap compared to edge crossings so we might as well
  // check all the vertices.
  for (int i = 0; i < num_vertices(); ++i) {
    if (cell.Contains(vertex(i))) return true;
  }
  S2Point cell_vertices[4];
  for (int i = 0; i < 4; ++i) {
    cell_vertices[i] = cell.GetVertex(i);
  }
  for (int j = 0; j < 4; ++j) {
    S2EdgeCrosser crosser(&cell_vertices[j], &cell_vertices[(j+1)&3],
                                    &vertex(0));
    for (int i = 1; i < num_vertices(); ++i) {
      if (crosser.CrossingSign(&vertex(i)) >= 0) {
        // There is a proper crossing, or two vertices were the same.
        return true;
      }
    }
  }
  return false;
}